

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O2

void __thiscall
NodeParser::parseInitQual
          (NodeParser *this,Node *node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  bool bVar2;
  InputError *pIVar3;
  string *s;
  string local_68;
  string local_48;
  double local_28;
  double x;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(tokenList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_68,"",(allocator *)&local_28);
    InputError::InputError(pIVar3,2,&local_68);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  s = pbVar1 + 1;
  bVar2 = Utilities::parseNumber<double>(s,&local_28);
  if ((bVar2) && (0.0 <= local_28)) {
    node->initQual = local_28;
    return;
  }
  pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_48,(string *)s);
  InputError::InputError(pIVar3,6,&local_48);
  __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void NodeParser::parseInitQual(Node* node, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - node ID
    // 1 - initial quality concentration

    if ( tokenList.size() < 2 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    double x;
    if ( !Utilities::parseNumber(tokens[1], x) || x < 0.0)
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[1]);
    }
    node->initQual = x;
}